

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkMutableDescriptorTypeCreateInfoEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkMutableDescriptorTypeCreateInfoEXT>
          (Impl *this,VkMutableDescriptorTypeCreateInfoEXT *src,size_t count,ScratchAllocator *alloc
          )

{
  VkMutableDescriptorTypeCreateInfoEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkMutableDescriptorTypeCreateInfoEXT>(alloc,count);
    if (pVVar1 != (VkMutableDescriptorTypeCreateInfoEXT *)0x0) {
      pVVar1 = (VkMutableDescriptorTypeCreateInfoEXT *)memmove(pVVar1,src,count << 5);
      return pVVar1;
    }
  }
  return (VkMutableDescriptorTypeCreateInfoEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}